

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 float64_log2_x86_64(float64 a,float_status *status)

{
  long lVar1;
  float64 fVar2;
  ulong uVar3;
  float_status *status_00;
  uint64_t uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint64_t aSig1;
  uint64_t aSig0;
  
  fVar2 = float64_squash_input_denormal_x86_64(a,status);
  status_00 = (float_status *)(fVar2 & 0xfffffffffffff);
  uVar6 = (uint)(fVar2 >> 0x34) & 0x7ff;
  if (uVar6 == 0) {
    if (status_00 == (float_status *)0x0) {
      return 0xfff0000000000000;
    }
    lVar1 = 0x3f;
    if (status_00 != (float_status *)0x0) {
      for (; (ulong)status_00 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar6 = ((uint)lVar1 ^ 0x3f) + 0xf5;
    status_00 = (float_status *)((long)status_00 << ((byte)uVar6 & 0x3f));
    uVar6 = 1 - (uVar6 & 0xff);
  }
  if ((long)fVar2 < 0) {
    status->float_exception_flags = status->float_exception_flags | 1;
    fVar2 = float64_default_nan_x86_64(status_00);
    return fVar2;
  }
  if (uVar6 != 0x7ff) {
    uVar4 = (ulong)status_00 | 0x10000000000000;
    uVar7 = (ulong)(uVar6 + 0xc01) << 0x34;
    for (uVar3 = 0x8000000000000; uVar3 != 0; uVar3 = uVar3 >> 1) {
      mul64To128(uVar4,uVar4,&aSig0,&aSig1);
      uVar5 = aSig1 >> 0x34 | aSig0 << 0xc;
      uVar4 = uVar5 >> ((byte)((aSig0 << 0xc) >> 0x35) & 1);
      uVar7 = uVar7 | (long)(uVar5 << 10) >> 0x3f & uVar3;
    }
    uVar4 = -uVar7;
    if (0x3fe < (int)uVar6) {
      uVar4 = uVar7;
    }
    fVar2 = normalizeRoundAndPackFloat64((int)uVar6 < 0x3ff,0x408,uVar4,status);
    return fVar2;
  }
  if (status_00 == (float_status *)0x0) {
    return fVar2;
  }
  fVar2 = propagateFloat64NaN(fVar2,0,status);
  return fVar2;
}

Assistant:

float64 float64_log2(float64 a, float_status *status)
{
    flag aSign, zSign;
    int aExp;
    uint64_t aSig, aSig0, aSig1, zSig, i;
    a = float64_squash_input_denormal(a, status);

    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );

    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat64( 1, 0x7FF, 0 );
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
    }
    if ( aSign ) {
        float_raise(float_flag_invalid, status);
        return float64_default_nan(status);
    }
    if ( aExp == 0x7FF ) {
        if (aSig) {
            return propagateFloat64NaN(a, float64_zero, status);
        }
        return a;
    }

    aExp -= 0x3FF;
    aSig |= UINT64_C(0x0010000000000000);
    zSign = aExp < 0;
    zSig = (uint64_t)aExp << 52;
    for (i = 1LL << 51; i > 0; i >>= 1) {
        mul64To128( aSig, aSig, &aSig0, &aSig1 );
        aSig = ( aSig0 << 12 ) | ( aSig1 >> 52 );
        if ( aSig & UINT64_C(0x0020000000000000) ) {
            aSig >>= 1;
            zSig |= i;
        }
    }

    if ( zSign )
#ifdef _MSC_VER
        zSig = 0 - zSig;
#else
        zSig = -zSig;
#endif
    return normalizeRoundAndPackFloat64(zSign, 0x408, zSig, status);
}